

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::expression_read_implies_multiple_reads(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  SPIRExpression *pSVar2;
  
  pSVar2 = Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,id);
  if (pSVar2 == (SPIRExpression *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = pSVar2->emitted_loop_level < (this->super_Compiler).current_loop_level;
  }
  return bVar1;
}

Assistant:

bool CompilerGLSL::expression_read_implies_multiple_reads(uint32_t id) const
{
	auto *expr = maybe_get<SPIRExpression>(id);
	if (!expr)
		return false;

	// If we're emitting code at a deeper loop level than when we emitted the expression,
	// we're probably reading the same expression over and over.
	return current_loop_level > expr->emitted_loop_level;
}